

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O2

CMDPSTATE * __thiscall RSTARPlanner::GetState(RSTARPlanner *this,int stateID)

{
  DiscreteSpaceInformation *pDVar1;
  pointer ppiVar2;
  long lVar3;
  CMDPSTATE *pCVar4;
  ostream *poVar5;
  SBPL_Exception *this_00;
  allocator<char> local_1c1;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  ppiVar2 = (pDVar1->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(pDVar1->StateID2IndexMapping).
                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppiVar2) >> 3) <= stateID) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"ERROR int GetState: stateID ",&local_1c1);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&local_1c0,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&local_1c0);
    poVar5 = (ostream *)std::ostream::operator<<(local_190,stateID);
    std::operator<<(poVar5," is invalid");
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    SBPL_Exception::SBPL_Exception(this_00,&local_1c0);
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = (long)*ppiVar2[stateID];
  if (lVar3 != -1) {
    return (this->pSearchStateSpace->searchMDP).StateArray.
           super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar3];
  }
  pCVar4 = CreateState(this,stateID);
  return pCVar4;
}

Assistant:

CMDPSTATE* RSTARPlanner::GetState(int stateID)
{
    if (stateID >= (int)environment_->StateID2IndexMapping.size()) {
        SBPL_ERROR("ERROR int GetState: stateID %d is invalid\n", stateID);
        std::stringstream ss("ERROR int GetState: stateID ");
        ss << stateID << " is invalid";
        throw SBPL_Exception(ss.str());
    }

    if (environment_->StateID2IndexMapping[stateID][RSTARMDP_STATEID2IND] == -1)
        return CreateState(stateID);
    else
        return pSearchStateSpace->searchMDP.StateArray[environment_->StateID2IndexMapping[stateID][RSTARMDP_STATEID2IND]];
}